

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O3

void FT_Vector_Polarize(FT_Vector *vec,FT_Fixed *length,FT_Angle *angle)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar8;
  int iVar9;
  FT_Vector v;
  FT_Vector local_38;
  long lVar7;
  
  if (angle != (FT_Angle *)0x0 && (length != (FT_Fixed *)0x0 && vec != (FT_Vector *)0x0)) {
    local_38.x = vec->x;
    lVar4 = vec->y;
    if (local_38.x != 0 || lVar4 != 0) {
      lVar3 = -local_38.x;
      if (0 < local_38.x) {
        lVar3 = local_38.x;
      }
      lVar7 = -lVar4;
      if (0 < lVar4) {
        lVar7 = lVar4;
      }
      uVar6 = (uint)lVar7 | (uint)lVar3;
      uVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (uVar1 < 0x1e) {
        iVar9 = 0x1d - uVar1;
        local_38.x = local_38.x << ((byte)iVar9 & 0x3f);
        local_38.y = lVar4 << ((byte)iVar9 & 0x3f);
      }
      else {
        iVar9 = (uVar1 ^ 0x1f) - 2;
        bVar2 = 2 - (char)(uVar1 ^ 0x1f);
        local_38.x = local_38.x >> (bVar2 & 0x3f);
        local_38.y = lVar4 >> (bVar2 & 0x3f);
      }
      ft_trig_pseudo_polarize(&local_38);
      lVar4 = -local_38.x;
      if (0 < local_38.x) {
        lVar4 = local_38.x;
      }
      uVar5 = lVar4 * 0xdbd95b16 + 0x40000000U >> 0x20;
      uVar8 = -uVar5;
      if (-1 < local_38.x) {
        uVar8 = uVar5;
      }
      uVar5 = (ulong)(uint)((int)uVar8 << (-(byte)iVar9 & 0x1f));
      if (-1 < iVar9) {
        uVar5 = (long)uVar8 >> ((byte)iVar9 & 0x3f);
      }
      *length = uVar5;
      *angle = local_38.y;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Polarize( FT_Vector*  vec,
                      FT_Fixed   *length,
                      FT_Angle   *angle )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec || !length || !angle )
      return;

    v = *vec;

    if ( v.x == 0 && v.y == 0 )
      return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_polarize( &v );

    v.x = ft_trig_downscale( v.x );

    *length = shift >= 0 ?                      ( v.x >>  shift )
                         : (FT_Fixed)( (FT_UInt32)v.x << -shift );
    *angle  = v.y;
  }